

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O0

void __thiscall
llbuild::buildsystem::BuildKey::BuildKey<llbuild::basic::StringList>
          (BuildKey *this,char kindCode,StringRef name,StringList *data)

{
  size_type sVar1;
  char *pcVar2;
  AlignedCharArrayUnion<unsigned_char,_char,_char,_char,_char,_char,_char,_char,_char,_char> *pAVar3
  ;
  void *pvVar4;
  uchar *__src;
  ulong uVar5;
  KeyType local_1d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1b8;
  uint local_19c;
  undefined1 local_198 [4];
  uint32_t pos;
  string encodedKey;
  undefined1 local_158 [4];
  uint32_t dataSize;
  BinaryEncoder encoder;
  uint32_t nameSize;
  StringList *data_local;
  char kindCode_local;
  BuildKey *this_local;
  StringRef name_local;
  
  name_local.Data = (char *)name.Length;
  this_local = (BuildKey *)name.Data;
  core::KeyType::KeyType(&this->key);
  name_local.Length = (size_t)&this_local;
  encoder.encdata.super_SmallVectorStorage<unsigned_char,_256U>.InlineElts._252_4_ =
       SUB84(name_local.Data,0);
  basic::BinaryEncoder::BinaryEncoder((BinaryEncoder *)local_158);
  basic::BinaryEncoder::write<llbuild::basic::StringList>((BinaryEncoder *)local_158,data);
  basic::BinaryEncoder::contents
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)&encodedKey.field_2 + 8),(BinaryEncoder *)local_158);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     ((long)&encodedKey.field_2 + 8));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)&encodedKey.field_2 + 8));
  std::__cxx11::string::string((string *)local_198);
  std::__cxx11::string::resize((ulong)local_198);
  local_19c = 0;
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_198);
  *pcVar2 = kindCode;
  local_19c = local_19c + 1;
  pAVar3 = (AlignedCharArrayUnion<unsigned_char,_char,_char,_char,_char,_char,_char,_char,_char,_char>
            *)std::__cxx11::string::operator[]((ulong)local_198);
  *(undefined4 *)pAVar3 =
       encoder.encdata.super_SmallVectorStorage<unsigned_char,_256U>.InlineElts._252_4_;
  local_19c = local_19c + 4;
  pvVar4 = (void *)std::__cxx11::string::operator[]((ulong)local_198);
  memcpy(pvVar4,this_local,
         (ulong)(uint)encoder.encdata.super_SmallVectorStorage<unsigned_char,_256U>.InlineElts.
                      _252_4_);
  local_19c = encoder.encdata.super_SmallVectorStorage<unsigned_char,_256U>.InlineElts._252_4_ +
              local_19c;
  pvVar4 = (void *)std::__cxx11::string::operator[]((ulong)local_198);
  basic::BinaryEncoder::contents(&local_1b8,(BinaryEncoder *)local_158);
  __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&local_1b8);
  memcpy(pvVar4,__src,sVar1 & 0xffffffff);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1b8);
  local_19c = (int)sVar1 + local_19c;
  uVar5 = std::__cxx11::string::size();
  if (uVar5 == local_19c) {
    core::KeyType::KeyType(&local_1d8,(string *)local_198);
    core::KeyType::operator=(&this->key,&local_1d8);
    core::KeyType::~KeyType(&local_1d8);
    std::__cxx11::string::~string((string *)local_198);
    basic::BinaryEncoder::~BinaryEncoder((BinaryEncoder *)local_158);
    return;
  }
  __assert_fail("encodedKey.size() == pos",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildKey.h"
                ,0x67,
                "llbuild::buildsystem::BuildKey::BuildKey(char, StringRef, const BinaryEncodable &) [BinaryEncodable = llbuild::basic::StringList]"
               );
}

Assistant:

BuildKey(char kindCode, StringRef name, const BinaryEncodable& data) {
    uint32_t nameSize = name.size();

    // FIXME: Perhaps should use this encoder for the key itself? Right now
    // we're manually building the keys and causing some extra memcpy overhead
    // here.
    basic::BinaryEncoder encoder;
    encoder.write(data);
    uint32_t dataSize = encoder.contents().size();

    std::string encodedKey;
    encodedKey.resize(1 + sizeof(uint32_t) + nameSize + dataSize);
    uint32_t pos = 0;
    encodedKey[pos] = kindCode; pos += 1;
    memcpy(&encodedKey[pos], &nameSize, sizeof(uint32_t));
    pos += sizeof(uint32_t);
    memcpy(&encodedKey[pos], name.data(), nameSize);
    pos += nameSize;
    memcpy(&encodedKey[pos], encoder.contents().data(), dataSize);
    pos += dataSize;
    assert(encodedKey.size() == pos);
    (void)pos;
    key = encodedKey;
  }